

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O0

ANNkd_ptr rkd_tree(ANNpointArray pa,ANNidxArray pidx,int n,int dim,int bsp,ANNorthRect *bnd_box,
                  ANNkd_splitter splitter)

{
  ANNkd_ptr pAVar1;
  undefined4 in_ECX;
  int in_EDX;
  ANNpointArray in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  long *in_R9;
  ANNkd_splitter unaff_retaddr;
  code *in_stack_00000008;
  ANNkd_split *ptr;
  ANNcoord hv;
  ANNcoord lv;
  ANNkd_node *hi;
  ANNkd_node *lo;
  int n_lo;
  ANNcoord cv;
  int cd;
  ANNidxArray in_stack_ffffffffffffff50;
  ANNkd_ptr hc;
  ANNcoord in_stack_ffffffffffffff58;
  ANNkd_leaf *in_stack_ffffffffffffff60;
  ANNkd_leaf *in_stack_ffffffffffffff68;
  ANNkd_leaf *in_stack_ffffffffffffff70;
  ANNkd_leaf *in_stack_ffffffffffffff78;
  ANNkd_split *in_stack_ffffffffffffff80;
  int d3;
  ANNkd_leaf *in_stack_ffffffffffffff88;
  ANNcoord hv_00;
  ANNcoord lv_00;
  int cd_00;
  ANNkd_split *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ANNorthRect *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd8;
  ANNkd_leaf *local_8;
  
  if (in_R8D < in_EDX) {
    hc = (ANNkd_ptr)&stack0xffffffffffffffb4;
    (*in_stack_00000008)(in_RDI,in_RSI,in_R9,in_EDX,in_ECX,&stack0xffffffffffffffc0,&local_48);
    lv_00 = *(ANNcoord *)(*in_R9 + (long)in_stack_ffffffffffffffc0 * 8);
    hv_00 = *(ANNcoord *)(in_R9[1] + (long)in_stack_ffffffffffffffc0 * 8);
    *(undefined8 *)(in_R9[1] + (long)in_stack_ffffffffffffffc0 * 8) = local_48;
    pAVar1 = rkd_tree(in_RSI,(ANNidxArray)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffd8,
                      (int)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc8,unaff_retaddr);
    cd_00 = (int)((ulong)pAVar1 >> 0x20);
    *(ANNcoord *)(in_R9[1] + (long)in_stack_ffffffffffffffc0 * 8) = hv_00;
    *(undefined8 *)(*in_R9 + (long)in_stack_ffffffffffffffc0 * 8) = local_48;
    pAVar1 = rkd_tree(in_RSI,(ANNidxArray)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffd8,
                      (int)((ulong)in_R9 >> 0x20),in_stack_ffffffffffffffc8,unaff_retaddr);
    *(ANNcoord *)(*in_R9 + (long)in_stack_ffffffffffffffc0 * 8) = lv_00;
    if (TreeTopology[in_stack_ffffffffffffffc0] == 3) {
      if (TreeP3Topology[in_stack_ffffffffffffffc0] == 0) {
        in_stack_ffffffffffffff78 = (ANNkd_leaf *)operator_new(0x78);
        ANNkd_split::ANNkd_split
                  (in_stack_ffffffffffffffb0,cd_00,(ANNcoord)pAVar1,lv_00,hv_00,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                   (ANNcoord)in_stack_ffffffffffffff78,(ANNcoord)in_stack_ffffffffffffff70,
                   (ANNcoord)in_stack_ffffffffffffff68,(ANNcoord)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff58,
                   (ANNcoord)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pAVar1,
                   (ANNkd_ptr)in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff78;
      }
      d3 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
      if (TreeP3Topology[in_stack_ffffffffffffffc0] == 1) {
        in_stack_ffffffffffffff70 = (ANNkd_leaf *)operator_new(0x78);
        ANNkd_split::ANNkd_split
                  (in_stack_ffffffffffffffb0,cd_00,(ANNcoord)pAVar1,lv_00,hv_00,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,d3
                   ,(ANNcoord)in_stack_ffffffffffffff78,(ANNcoord)in_stack_ffffffffffffff70,
                   (ANNcoord)in_stack_ffffffffffffff68,(ANNcoord)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff58,
                   (ANNcoord)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pAVar1,
                   (ANNkd_ptr)in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff70;
      }
      if (TreeP3Topology[in_stack_ffffffffffffffc0] == 2) {
        in_stack_ffffffffffffff68 = (ANNkd_leaf *)operator_new(0x78);
        ANNkd_split::ANNkd_split
                  (in_stack_ffffffffffffffb0,cd_00,(ANNcoord)pAVar1,lv_00,hv_00,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,d3
                   ,(ANNcoord)in_stack_ffffffffffffff78,(ANNcoord)in_stack_ffffffffffffff70,
                   (ANNcoord)in_stack_ffffffffffffff68,(ANNcoord)in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff58,
                   (ANNcoord)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pAVar1,
                   (ANNkd_ptr)in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff68;
      }
      local_8 = in_stack_ffffffffffffff88;
      if (TreeP3Topology[in_stack_ffffffffffffffc0] == 3) {
        local_8 = (ANNkd_leaf *)operator_new(0x78);
        ANNkd_split::ANNkd_split
                  (in_stack_ffffffffffffffb0,cd_00,(ANNcoord)pAVar1,lv_00,hv_00,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,d3
                   ,(ANNcoord)in_stack_ffffffffffffff78,(ANNcoord)in_stack_ffffffffffffff70,
                   (ANNcoord)in_stack_ffffffffffffff68,(ANNcoord)local_8,in_stack_ffffffffffffff58,
                   (ANNcoord)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),pAVar1,
                   (ANNkd_ptr)in_stack_ffffffffffffffc8);
      }
    }
    else {
      local_8 = (ANNkd_leaf *)operator_new(0x78);
      ANNkd_split::ANNkd_split
                (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (ANNcoord)in_stack_ffffffffffffff70,(ANNcoord)in_stack_ffffffffffffff68,
                 (ANNcoord)in_stack_ffffffffffffff60,(ANNkd_ptr)local_8,hc);
    }
  }
  else if (in_EDX == 0) {
    local_8 = KD_TRIVIAL;
  }
  else {
    local_8 = (ANNkd_leaf *)operator_new(0x18);
    ANNkd_leaf::ANNkd_leaf
              (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               in_stack_ffffffffffffff50);
  }
  return &local_8->super_ANNkd_node;
}

Assistant:

ANNkd_ptr rkd_tree(           // recursive construction of kd-tree
    ANNpointArray pa,         // point array
    ANNidxArray pidx,         // point indices to store in subtree
    int n,                    // number of points
    int dim,                  // dimension of space
    int bsp,                  // bucket space
    ANNorthRect &bnd_box,     // bounding box for current node
    ANNkd_splitter splitter)  // splitting routine
{
    if (n <= bsp) {             // n small, make a leaf node
        if (n == 0)             // empty leaf node
            return KD_TRIVIAL;  // return (canonical) empty leaf
        else                    // construct the node and return
            return new ANNkd_leaf(n, pidx);
    } else {                  // n large, make a splitting node
        int cd;               // cutting dimension
        ANNcoord cv;          // cutting value
        int n_lo;             // number on low side of cut
        ANNkd_node *lo, *hi;  // low and high children

        // invoke splitting procedure
        (*splitter)(pa, pidx, bnd_box, n, dim, cd, cv, n_lo);

        ANNcoord lv = bnd_box.lo[cd];  // save bounds for cutting dimension
        ANNcoord hv = bnd_box.hi[cd];

        bnd_box.hi[cd] = cv;  // modify bounds for left subtree
        lo = rkd_tree(        // build left subtree
            pa, pidx, n_lo,   // ...from pidx[0..n_lo-1]
            dim, bsp, bnd_box, splitter);
        bnd_box.hi[cd] = hv;  // restore bounds

        bnd_box.lo[cd] = cv;            // modify bounds for right subtree
        hi = rkd_tree(                  // build right subtree
            pa, pidx + n_lo, n - n_lo,  // ...from pidx[n_lo..n-1]
            dim, bsp, bnd_box, splitter);
        bnd_box.lo[cd] = lv;  // restore bounds

        // create the splitting node
        ANNkd_split *ptr;
        if (TreeTopology[cd] == 3) {
            if (TreeP3Topology[cd] == 0)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd + 1, cd + 2, cd + 3, bnd_box.lo[cd + 1],
                    bnd_box.hi[cd + 1], bnd_box.lo[cd + 2], bnd_box.hi[cd + 2],
                    bnd_box.lo[cd + 3], bnd_box.hi[cd + 3], lo, hi);
            if (TreeP3Topology[cd] == 1)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 1, cd + 1, cd + 2, bnd_box.lo[cd - 1],
                    bnd_box.hi[cd - 1], bnd_box.lo[cd + 1], bnd_box.hi[cd + 1],
                    bnd_box.lo[cd + 2], bnd_box.hi[cd + 2], lo, hi);
            if (TreeP3Topology[cd] == 2)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 2, cd - 1, cd + 1, bnd_box.lo[cd - 2],
                    bnd_box.hi[cd - 2], bnd_box.lo[cd - 1], bnd_box.hi[cd - 1],
                    bnd_box.lo[cd + 1], bnd_box.hi[cd + 1], lo, hi);
            if (TreeP3Topology[cd] == 3)
                ptr = new ANNkd_split(
                    cd, cv, lv, hv, cd - 3, cd - 2, cd - 1, bnd_box.lo[cd - 3],
                    bnd_box.hi[cd - 3], bnd_box.lo[cd - 2], bnd_box.hi[cd - 2],
                    bnd_box.lo[cd - 1], bnd_box.hi[cd - 1], lo, hi);
        } else {
            ptr = new ANNkd_split(cd, cv, lv, hv, lo, hi);
        }

        return ptr;  // return pointer to this node
    }
}